

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TexImageCubeArrayDepthCase::createTexture
          (TexImageCubeArrayDepthCase *this)

{
  int depth;
  int internalFormat;
  deUint32 err;
  int width;
  TransferFormat TVar1;
  void *data;
  PixelBufferAccess local_e8;
  PixelBufferAccess local_c0;
  undefined1 local_94 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelW;
  int ndx;
  TextureFormat local_60;
  undefined1 local_58 [8];
  TextureLevel levelData;
  deUint32 tex;
  deUint32 local_20;
  deUint32 dStack_1c;
  TransferFormat fmt;
  TexImageCubeArrayDepthCase *this_local;
  
  TVar1 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  levelData.m_data.m_cap._4_4_ = 0;
  local_20 = TVar1.format;
  dStack_1c = TVar1.dataType;
  local_60 = glu::mapGLTransferFormat(local_20,dStack_1c);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_58,&local_60);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf5,1);
  err = sglr::ContextWrapper::glGetError
                  (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.
                    super_ContextWrapper);
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                  ,0x267);
  for (gMin.m_data[3] = 0.0;
      (int)gMin.m_data[3] < (this->super_TextureCubeArraySpecCase).m_numLevels;
      gMin.m_data[3] = (float)((int)gMin.m_data[3] + 1)) {
    width = de::max<int>(1,(this->super_TextureCubeArraySpecCase).m_size >>
                           (gMin.m_data[3]._0_1_ & 0x1f));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-1.5,-2.0,1.7,-1.5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_94,2.0,1.5,-1.0,2.0);
    tcu::TextureLevel::setSize
              ((TextureLevel *)local_58,width,width,(this->super_TextureCubeArraySpecCase).m_depth);
    tcu::TextureLevel::getAccess(&local_c0,(TextureLevel *)local_58);
    tcu::fillWithComponentGradients(&local_c0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_94);
    depth = (this->super_TextureCubeArraySpecCase).m_depth;
    internalFormat = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
    tcu::TextureLevel::getAccess(&local_e8,(TextureLevel *)local_58);
    data = tcu::PixelBufferAccess::getDataPtr(&local_e8);
    sglr::ContextWrapper::glTexImage3D
              (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
               0x9009,(int)gMin.m_data[3],internalFormat,width,width,depth,0,local_20,dStack_1c,data
              );
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_58);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_size >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelW, m_depth);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, m_internalFormat, levelW, levelW, m_depth, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}